

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colWord.c
# Opt level: O0

Col_Word Col_NewIntWord(intptr_t value)

{
  Col_Word word;
  intptr_t value_local;
  
  if ((value < 0x4000000000000000) && (-0x4000000000000001 < value)) {
    value_local = value << 1 | 1;
  }
  else {
    value_local = (intptr_t)AllocCells(1);
    (*(Cell *)value_local)[0] = '\x02';
    (*(Cell *)value_local)[1] = '\0';
    *(char *)(value_local + 2) = '\x04';
    *(char *)(value_local + 3) = '\0';
    *(char *)(value_local + 8) = '\0';
    *(char *)(value_local + 9) = '\0';
    *(char *)(value_local + 10) = '\0';
    *(char *)(value_local + 0xb) = '\0';
    *(char *)(value_local + 0xc) = '\0';
    *(char *)(value_local + 0xd) = '\0';
    *(char *)(value_local + 0xe) = '\0';
    *(char *)(value_local + 0xf) = '\0';
    *(intptr_t *)(*(Cell *)value_local + 0x10) = value;
  }
  return value_local;
}

Assistant:

Col_Word
Col_NewIntWord(
    intptr_t value) /*!< Integer value of the word to create. */
{
    Col_Word word;  /* Resulting word in the general case. */

    /*
     * Return immediate value if possible.
     */

    if (value <= SMALLINT_MAX && value >= SMALLINT_MIN) {
        return WORD_SMALLINT_NEW(value);
    }

    /*
     * Create a new integer word.
     */

    word = (Col_Word) AllocCells(1);
    WORD_INTWRAP_INIT(word, 0, value);

    return word;
}